

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::UniformCollection::containsMatchingBasicType
          (UniformCollection *this,dataTypePredicate predicate)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  int local_24;
  int i;
  dataTypePredicate predicate_local;
  UniformCollection *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
            ::size(&this->m_uniforms);
    if ((int)sVar2 <= local_24) {
      return false;
    }
    pvVar3 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
             ::operator[](&this->m_uniforms,(long)local_24);
    bVar1 = typeContainsMatchingBasicType(&pvVar3->type,predicate);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool containsMatchingBasicType (const dataTypePredicate predicate) const
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			if (typeContainsMatchingBasicType(m_uniforms[i].type, predicate))
				return true;
		return false;
	}